

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# guard_builder.cpp
# Opt level: O2

void __thiscall
r_exec::ConstGuardBuilder::_build
          (ConstGuardBuilder *this,Code *mdl,uint16_t fwd_opcode,uint16_t bwd_opcode,uint16_t q0,
          uint16_t t0,uint16_t t1,uint16_t *write_index)

{
  ushort uVar1;
  uint16_t *puVar2;
  short sVar3;
  ConstGuardBuilder *pCVar4;
  undefined2 uVar5;
  uint16_t uVar6;
  uint16_t uVar7;
  int iVar8;
  undefined4 extraout_var;
  long *plVar9;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined6 in_register_0000000a;
  uint uVar10;
  undefined6 in_register_00000012;
  uchar uVar11;
  ushort uVar12;
  TimingGuardBuilder *this_00;
  TimingGuardBuilder *this_01;
  undefined6 in_register_00000082;
  undefined6 in_register_0000008a;
  TimingGuardBuilder TStack_68;
  undefined4 local_50;
  undefined4 local_4c;
  ConstGuardBuilder *local_48;
  uint local_3c;
  undefined4 local_38;
  undefined4 local_34;
  
  this_00 = &TStack_68;
  this_01 = &TStack_68;
  TStack_68.period._0_4_ = (uint)CONCAT62(in_register_0000008a,t0);
  local_50 = (undefined4)CONCAT62(in_register_00000082,q0);
  local_38 = (undefined4)CONCAT62(in_register_0000000a,bwd_opcode);
  local_34 = (undefined4)CONCAT62(in_register_00000012,fwd_opcode);
  local_48 = this;
  iVar8 = (*(mdl->super__Object)._vptr__Object[9])(mdl,1);
  plVar9 = (long *)CONCAT44(extraout_var,iVar8);
  (**(code **)(*plVar9 + 0x20))(plVar9,2);
  uVar5 = r_code::Atom::asIndex();
  TStack_68.super_GuardBuilder.super__Object.refCount.super___atomic_base<long>._M_i._0_4_ =
       CONCAT22(TStack_68.super_GuardBuilder.super__Object.refCount.super___atomic_base<long>._M_i.
                _2_2_,uVar5);
  (**(code **)(*plVar9 + 0x20))(plVar9,3);
  uVar5 = r_code::Atom::asIndex();
  TStack_68.super_GuardBuilder.super__Object.refCount.super___atomic_base<long>._M_i._4_4_ =
       CONCAT22(TStack_68.super_GuardBuilder.super__Object.refCount.super___atomic_base<long>._M_i.
                _6_2_,uVar5);
  plVar9 = (long *)(**(code **)(*plVar9 + 0x48))(plVar9,0);
  (**(code **)(*plVar9 + 0x20))(plVar9,3);
  local_4c = r_code::Atom::asIndex();
  iVar8 = (*(mdl->super__Object)._vptr__Object[9])(mdl,1);
  plVar9 = (long *)CONCAT44(extraout_var_00,iVar8);
  (**(code **)(*plVar9 + 0x20))(plVar9,2);
  uVar6 = r_code::Atom::asIndex();
  (**(code **)(*plVar9 + 0x20))(plVar9,3);
  uVar7 = r_code::Atom::asIndex();
  *write_index = *write_index + 1;
  uVar12 = (ushort)&TStack_68;
  r_code::Atom::IPointer(uVar12);
  iVar8 = (*(mdl->super__Object)._vptr__Object[4])(mdl,3);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_01,iVar8),(Atom *)&TStack_68);
  TStack_68.period._4_2_ = uVar6;
  TStack_68.period._6_2_ = uVar7;
  r_code::Atom::~Atom((Atom *)&TStack_68);
  uVar11 = (uchar)&TStack_68;
  r_code::Atom::Set(uVar11);
  iVar8 = (*(mdl->super__Object)._vptr__Object[4])(mdl,(ulong)*write_index);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_02,iVar8),(Atom *)&TStack_68);
  r_code::Atom::~Atom((Atom *)&TStack_68);
  pCVar4 = local_48;
  TStack_68.super_GuardBuilder.super__Object._vptr__Object._6_2_ = *write_index + 3;
  puVar2 = (uint16_t *)((long)&TStack_68.super_GuardBuilder.super__Object._vptr__Object + 6);
  uVar6 = (uint16_t)
          TStack_68.super_GuardBuilder.super__Object.refCount.super___atomic_base<long>._M_i;
  uVar7 = (uint16_t)TStack_68.period;
  uVar10 = (uint)TStack_68.super_GuardBuilder.super__Object.refCount.super___atomic_base<long>._M_i
           & 0xffff;
  TStack_68.super_GuardBuilder.super__Object.refCount.super___atomic_base<long>._M_i._0_4_ =
       (uint)TStack_68.period & 0xffff;
  TStack_68.period._0_4_ = uVar10;
  TimingGuardBuilder::write_guard
            (this_00,mdl,uVar6,uVar7,Opcodes::Add,(local_48->super_TimingGuardBuilder).period,
             write_index,puVar2);
  uVar6 = TStack_68.super_GuardBuilder.super__Object.refCount.super___atomic_base<long>._M_i._4_2_;
  TStack_68.super_GuardBuilder.super__Object.refCount.super___atomic_base<long>._M_i._4_4_ =
       TStack_68.super_GuardBuilder.super__Object.refCount.super___atomic_base<long>._M_i._4_4_ &
       0xffff;
  local_3c = (uint)t1;
  TimingGuardBuilder::write_guard
            (this_00,mdl,uVar6,t1,Opcodes::Add,(pCVar4->super_TimingGuardBuilder).period,write_index
             ,puVar2);
  sVar3 = TStack_68.super_GuardBuilder.super__Object._vptr__Object._6_2_;
  uVar1 = TStack_68.super_GuardBuilder.super__Object._vptr__Object._6_2_ + 1;
  TStack_68.super_GuardBuilder.super__Object._vptr__Object._6_2_ = uVar1;
  r_code::Atom::AssignmentPointer(uVar11,(ushort)(byte)local_4c);
  uVar6 = *write_index;
  *write_index = uVar6 + 1;
  iVar8 = (*(mdl->super__Object)._vptr__Object[4])(mdl,(ulong)(ushort)(uVar6 + 1));
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_03,iVar8),(Atom *)&TStack_68);
  r_code::Atom::~Atom((Atom *)&TStack_68);
  r_code::Atom::Operator(uVar12,(uchar)local_34);
  iVar8 = (*(mdl->super__Object)._vptr__Object[4])(mdl,(ulong)uVar1);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_04,iVar8),(Atom *)&TStack_68);
  r_code::Atom::~Atom((Atom *)&TStack_68);
  r_code::Atom::VLPointer(uVar12,(ushort)local_50);
  iVar8 = (*(mdl->super__Object)._vptr__Object[4])(mdl,(ulong)(ushort)(sVar3 + 2));
  pCVar4 = local_48;
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_05,iVar8),(Atom *)&TStack_68);
  r_code::Atom::~Atom((Atom *)&TStack_68);
  r_code::Atom::Float((float)pCVar4->constant);
  TStack_68.super_GuardBuilder.super__Object._vptr__Object._6_2_ = sVar3 + 3;
  iVar8 = (*(mdl->super__Object)._vptr__Object[4])
                    (mdl,(ulong)TStack_68.super_GuardBuilder.super__Object._vptr__Object._6_2_);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_06,iVar8),(Atom *)&TStack_68);
  r_code::Atom::~Atom((Atom *)&TStack_68);
  *write_index = sVar3 + 5;
  r_code::Atom::IPointer(uVar12);
  iVar8 = (*(mdl->super__Object)._vptr__Object[4])(mdl,4);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_07,iVar8),(Atom *)&TStack_68);
  r_code::Atom::~Atom((Atom *)&TStack_68);
  r_code::Atom::Set(uVar11);
  iVar8 = (*(mdl->super__Object)._vptr__Object[4])(mdl,(ulong)*write_index);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_08,iVar8),(Atom *)&TStack_68);
  r_code::Atom::~Atom((Atom *)&TStack_68);
  TStack_68.super_GuardBuilder.super__Object._vptr__Object._6_2_ = *write_index + 5;
  puVar2 = (uint16_t *)((long)&TStack_68.super_GuardBuilder.super__Object._vptr__Object + 6);
  uVar6 = (uint16_t)(uint)TStack_68.period;
  TimingGuardBuilder::write_guard
            (this_01,mdl,
             (uint16_t)
             (uint)TStack_68.super_GuardBuilder.super__Object.refCount.super___atomic_base<long>.
                   _M_i,uVar6,Opcodes::Sub,(pCVar4->super_TimingGuardBuilder).period,write_index,
             puVar2);
  uVar7 = (uint16_t)
          TStack_68.super_GuardBuilder.super__Object.refCount.super___atomic_base<long>._M_i._4_4_;
  TimingGuardBuilder::write_guard
            (this_01,mdl,(uint16_t)local_3c,uVar7,Opcodes::Sub,
             (pCVar4->super_TimingGuardBuilder).period,write_index,puVar2);
  TimingGuardBuilder::write_guard
            (this_01,mdl,TStack_68.period._4_2_,uVar6,Opcodes::Sub,pCVar4->offset,write_index,puVar2
            );
  TimingGuardBuilder::write_guard
            (this_01,mdl,TStack_68.period._6_2_,uVar7,Opcodes::Sub,pCVar4->offset,write_index,puVar2
            );
  sVar3 = TStack_68.super_GuardBuilder.super__Object._vptr__Object._6_2_;
  uVar1 = TStack_68.super_GuardBuilder.super__Object._vptr__Object._6_2_ + 1;
  r_code::Atom::AssignmentPointer(uVar11,(ushort)(byte)local_50);
  uVar6 = *write_index;
  *write_index = uVar6 + 1;
  iVar8 = (*(mdl->super__Object)._vptr__Object[4])(mdl,(ulong)(ushort)(uVar6 + 1));
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_09,iVar8),(Atom *)&TStack_68);
  r_code::Atom::~Atom((Atom *)&TStack_68);
  r_code::Atom::Operator(uVar12,(uchar)local_38);
  iVar8 = (*(mdl->super__Object)._vptr__Object[4])(mdl,(ulong)uVar1);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_10,iVar8),(Atom *)&TStack_68);
  r_code::Atom::~Atom((Atom *)&TStack_68);
  r_code::Atom::VLPointer(uVar12,(ushort)local_4c);
  iVar8 = (*(mdl->super__Object)._vptr__Object[4])(mdl,(ulong)(ushort)(sVar3 + 2));
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_11,iVar8),(Atom *)&TStack_68);
  r_code::Atom::~Atom((Atom *)&TStack_68);
  r_code::Atom::Float((float)local_48->constant);
  iVar8 = (*(mdl->super__Object)._vptr__Object[4])(mdl,(ulong)(ushort)(sVar3 + 3));
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_12,iVar8),(Atom *)&TStack_68);
  r_code::Atom::~Atom((Atom *)&TStack_68);
  *write_index = sVar3 + 4;
  return;
}

Assistant:

void ConstGuardBuilder::_build(Code *mdl, uint16_t fwd_opcode, uint16_t bwd_opcode, uint16_t q0, uint16_t t0, uint16_t t1, uint16_t &write_index) const
{
    Code *rhs = mdl->get_reference(1);
    uint16_t t2 = rhs->code(FACT_AFTER).asIndex();
    uint16_t t3 = rhs->code(FACT_BEFORE).asIndex();
    uint16_t q1 = rhs->get_reference(0)->code(MK_VAL_VALUE).asIndex();
    Code *lhs = mdl->get_reference(1);
    uint16_t t4 = lhs->code(FACT_AFTER).asIndex();
    uint16_t t5 = lhs->code(FACT_BEFORE).asIndex();
    mdl->code(MDL_FWD_GUARDS) = Atom::IPointer(++write_index);
    mdl->code(write_index) = Atom::Set(3);
    uint16_t extent_index = write_index + 3;
    write_guard(mdl, t2, t0, Opcodes::Add, period, write_index, extent_index);
    write_guard(mdl, t3, t1, Opcodes::Add, period, write_index, extent_index);
    mdl->code(++write_index) = Atom::AssignmentPointer(q1, ++extent_index);
    mdl->code(extent_index) = Atom::Operator(fwd_opcode, 2); // q1:(fwd_opcode q0 constant)
    mdl->code(++extent_index) = Atom::VLPointer(q0);
    mdl->code(++extent_index) = Atom::Float(constant);
    extent_index += 1;
    write_index = extent_index;
    mdl->code(MDL_BWD_GUARDS) = Atom::IPointer(++write_index);
    mdl->code(write_index) = Atom::Set(5);
    extent_index = write_index + 5;
    write_guard(mdl, t0, t2, Opcodes::Sub, period, write_index, extent_index);
    write_guard(mdl, t1, t3, Opcodes::Sub, period, write_index, extent_index);
    write_guard(mdl, t4, t2, Opcodes::Sub, offset, write_index, extent_index);
    write_guard(mdl, t5, t3, Opcodes::Sub, offset, write_index, extent_index);
    mdl->code(++write_index) = Atom::AssignmentPointer(q0, ++extent_index);
    mdl->code(extent_index) = Atom::Operator(bwd_opcode, 2); // q0:(bwd_opcode q1 constant)
    mdl->code(++extent_index) = Atom::VLPointer(q1);
    mdl->code(++extent_index) = Atom::Float(constant);
    extent_index += 1;
    write_index = extent_index;
}